

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_ghost.cpp
# Opt level: O3

void Omega_h::partition_by_verts(Mesh *mesh,bool verbose)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Alloc *pAVar3;
  Alloc *this;
  Alloc *this_00;
  LO nrroots;
  bool bVar4;
  bool bVar5;
  Read<long> old_owner_globals;
  Remotes elem_uses;
  Dist uses2old_owners;
  Dist elems2owners;
  GOs local_2e0;
  Alloc *local_2d0;
  element_type *local_2c8;
  Remotes local_2c0;
  CommPtr local_2a0;
  Alloc *local_290;
  pointer local_288;
  Alloc *local_280;
  pointer local_278;
  Dist local_270;
  Dist local_1e0;
  Dist local_150;
  Dist local_c0;
  
  get_own_verts2own_elems((RemoteGraph *)&local_270,mesh);
  local_2c0.idxs.write_.shared_alloc_.direct_ptr =
       local_270.roots2items_[1].write_.shared_alloc_.direct_ptr;
  local_2c0.ranks.write_.shared_alloc_.direct_ptr =
       local_270.roots2items_[0].write_.shared_alloc_.direct_ptr;
  local_290 = local_270.roots2items_[0].write_.shared_alloc_.alloc;
  local_288 = (pointer)local_270.roots2items_[0].write_.shared_alloc_.direct_ptr;
  if ((((ulong)local_270.roots2items_[0].write_.shared_alloc_.alloc & 7) == 0 &&
       local_270.roots2items_[0].write_.shared_alloc_.alloc != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    (local_270.roots2items_[0].write_.shared_alloc_.alloc)->use_count =
         (local_270.roots2items_[0].write_.shared_alloc_.alloc)->use_count + -1;
    local_290 = (Alloc *)((local_270.roots2items_[0].write_.shared_alloc_.alloc)->size * 8 + 1);
  }
  this = local_290;
  local_270.roots2items_[0].write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_270.roots2items_[0].write_.shared_alloc_.direct_ptr = (pointer)0x0;
  local_280 = local_270.roots2items_[1].write_.shared_alloc_.alloc;
  local_278 = (pointer)local_270.roots2items_[1].write_.shared_alloc_.direct_ptr;
  if ((((ulong)local_270.roots2items_[1].write_.shared_alloc_.alloc & 7) == 0 &&
       local_270.roots2items_[1].write_.shared_alloc_.alloc != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    (local_270.roots2items_[1].write_.shared_alloc_.alloc)->use_count =
         (local_270.roots2items_[1].write_.shared_alloc_.alloc)->use_count + -1;
    local_280 = (Alloc *)((local_270.roots2items_[1].write_.shared_alloc_.alloc)->size * 8 + 1);
  }
  this_00 = local_280;
  local_270.roots2items_[1].write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_270.roots2items_[1].write_.shared_alloc_.direct_ptr = (pointer)0x0;
  RemoteGraph::~RemoteGraph((RemoteGraph *)&local_270);
  Mesh::comm(mesh);
  bVar4 = ((ulong)this & 7) == 0;
  local_2c0.ranks.write_.shared_alloc_.alloc = this;
  if (bVar4 && this != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2c0.ranks.write_.shared_alloc_.alloc = (Alloc *)(this->size * 8 + 1);
    }
    else {
      this->use_count = this->use_count + 1;
    }
  }
  bVar5 = ((ulong)this_00 & 7) == 0;
  local_2c0.idxs.write_.shared_alloc_.alloc = this_00;
  if (bVar5 && this_00 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2c0.idxs.write_.shared_alloc_.alloc = (Alloc *)(this_00->size * 8 + 1);
    }
    else {
      this_00->use_count = this_00->use_count + 1;
    }
  }
  nrroots = Mesh::nelems(mesh);
  Dist::Dist(&local_270,&local_2a0,&local_2c0,nrroots);
  pAVar3 = local_2c0.idxs.write_.shared_alloc_.alloc;
  if (((ulong)local_2c0.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_2c0.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_2c0.idxs.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_2c0.idxs.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_2c0.ranks.write_.shared_alloc_.alloc;
  if (((ulong)local_2c0.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_2c0.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_2c0.ranks.write_.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_2c0.ranks.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  if (local_2a0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2a0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((uint)mesh->dim_ < 4) {
    Mesh::globals((Mesh *)&local_2d0,(Int)mesh);
    Dist::Dist(&local_150,&local_270);
    local_2e0.write_.shared_alloc_.alloc = local_2d0;
    if (((ulong)local_2d0 & 7) == 0 && local_2d0 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_2e0.write_.shared_alloc_.alloc = (Alloc *)(local_2d0->size * 8 + 1);
      }
      else {
        local_2d0->use_count = local_2d0->use_count + 1;
      }
    }
    local_2e0.write_.shared_alloc_.direct_ptr = local_2c8;
    get_new_copies2old_owners(&local_c0,&local_150,&local_2e0);
    pAVar3 = local_2e0.write_.shared_alloc_.alloc;
    if (((ulong)local_2e0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_2e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_2e0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_2e0.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    Dist::~Dist(&local_150);
    Dist::Dist(&local_1e0,&local_c0);
    migrate_mesh(mesh,&local_1e0,OMEGA_H_VERT_BASED,verbose);
    Dist::~Dist(&local_1e0);
    Dist::~Dist(&local_c0);
    if (((ulong)local_2d0 & 7) == 0 && local_2d0 != (Alloc *)0x0) {
      piVar1 = &local_2d0->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_2d0);
        operator_delete(local_2d0,0x48);
      }
    }
    Dist::~Dist(&local_270);
    if (bVar5 && this_00 != (Alloc *)0x0) {
      piVar1 = &this_00->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(this_00);
        operator_delete(this_00,0x48);
      }
    }
    if (bVar4 && this != (Alloc *)0x0) {
      piVar1 = &this->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(this);
        operator_delete(this,0x48);
      }
    }
    return;
  }
  fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
       ,0x33);
}

Assistant:

void partition_by_verts(Mesh* mesh, bool verbose) {
  /* vertex-based partitioning is defined as gathering the elements
   * adjacent to owned vertices, hence the graph from owned vertices
   * to elements already contains what we need and we can skip push_elem_uses()
   */
  auto elem_uses = get_own_verts2own_elems(mesh).edges2remotes;
  auto uses2old_owners = Dist(mesh->comm(), elem_uses, mesh->nelems());
  auto old_owner_globals = mesh->globals(mesh->dim());
  auto elems2owners =
      get_new_copies2old_owners(uses2old_owners, old_owner_globals);
  migrate_mesh(mesh, elems2owners, OMEGA_H_VERT_BASED, verbose);
}